

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

void __thiscall
BailOutRecord::DumpArgOffsets(BailOutRecord *this,uint count,int *offsets,int argOutSlotStart)

{
  int offset_00;
  code *pcVar1;
  BOOLEAN BVar2;
  BOOLEAN BVar3;
  bool bVar4;
  undefined4 *puVar5;
  bool isInt32;
  uint uStack_38;
  bool isFloat64;
  int offset;
  uint i;
  RegSlot regSlotOffset;
  char16 *name;
  int argOutSlotStart_local;
  int *offsets_local;
  uint count_local;
  BailOutRecord *this_local;
  
  uStack_38 = 0;
  do {
    if (count <= uStack_38) {
      return;
    }
    offset_00 = offsets[uStack_38];
    BVar2 = BVFixed::Test(this->argOutOffsetInfo->argOutFloat64Syms,argOutSlotStart + uStack_38);
    BVar3 = BVFixed::Test(this->argOutOffsetInfo->argOutLosslessInt32Syms,
                          argOutSlotStart + uStack_38);
    if ((BVar2 != '\0') && (BVar3 != '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x215,"(!isFloat64 || !isInt32)","!isFloat64 || !isInt32");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    Output::Print(L"%s #%3d: ",L"OutParam",(ulong)uStack_38);
    DumpValue(this,offset_00,BVar2 != '\0');
    Output::Print(L"\n");
    uStack_38 = uStack_38 + 1;
  } while( true );
}

Assistant:

void BailOutRecord::DumpArgOffsets(uint count, int* offsets, int argOutSlotStart)
{
    char16 const * name = _u("OutParam");
    Js::RegSlot regSlotOffset = 0;

    for (uint i = 0; i < count; i++)
    {
        int offset = offsets[i];

        // The variables below determine whether we have a Var or native float/int.
        bool isFloat64 = this->argOutOffsetInfo->argOutFloat64Syms->Test(argOutSlotStart + i) != 0;
        bool isInt32 = this->argOutOffsetInfo->argOutLosslessInt32Syms->Test(argOutSlotStart + i) != 0;
        Assert(!isFloat64 || !isInt32);

        Output::Print(_u("%s #%3d: "), name, i + regSlotOffset);
        this->DumpValue(offset, isFloat64);
        Output::Print(_u("\n"));
    }
}